

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

void __thiscall MD5::encode(MD5 *this,ulong *input,byte *output,size_t length)

{
  long lVar1;
  
  if (length != 0) {
    lVar1 = 0;
    do {
      output[lVar1 * 4] = (byte)input[lVar1];
      output[lVar1 * 4 + 1] = *(byte *)((long)input + lVar1 * 8 + 1);
      output[lVar1 * 4 + 2] = *(byte *)((long)input + lVar1 * 8 + 2);
      output[lVar1 * 4 + 3] = *(byte *)((long)input + lVar1 * 8 + 3);
      lVar1 = lVar1 + 1;
    } while ((length - 1 >> 2) + 1 != lVar1);
  }
  return;
}

Assistant:

void MD5::encode(const ulong *input, byte *output, size_t length)
{

    for (size_t i = 0, j = 0; j < length; i++, j += 4)
    {
        output[j] = (byte) (input[i] & 0xff);
        output[j + 1] = (byte) ((input[i] >> 8) & 0xff);
        output[j + 2] = (byte) ((input[i] >> 16) & 0xff);
        output[j + 3] = (byte) ((input[i] >> 24) & 0xff);
    }
}